

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

_Bool ImGui::BeginPopupContextItem(char *str_id,ImGuiPopupFlags popup_flags)

{
  _Bool _Var1;
  ImGuiID id;
  
  if (((ImGuiWindow *)GImGui->CurrentWindow)->SkipItems != false) {
    return false;
  }
  if (str_id == (char *)0x0) {
    id = (GImGui->LastItemData).ID;
  }
  else {
    id = ImGuiWindow::GetID((ImGuiWindow *)GImGui->CurrentWindow,str_id,(char *)0x0);
  }
  if (id != 0) {
    if ((popup_flags & 0x1fU) < 5) {
      if ((GImGui->IO).MouseReleased[popup_flags & 0x1fU] == true) {
        _Var1 = IsItemHovered(0x20);
        if (_Var1) {
          OpenPopupEx(id,popup_flags);
        }
      }
      _Var1 = BeginPopupEx(id,0x141);
      return _Var1;
    }
    __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*(g.IO.MouseDown))))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x13ad,"bool ImGui::IsMouseReleased(ImGuiMouseButton)");
  }
  __assert_fail("id != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0x2421,"bool ImGui::BeginPopupContextItem(const char *, ImGuiPopupFlags)");
}

Assistant:

bool ImGui::BeginPopupContextItem(const char* str_id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;
    ImGuiID id = str_id ? window->GetID(str_id) : g.LastItemData.ID;    // If user hasn't passed an ID, we can use the LastItemID. Using LastItemID as a Popup ID won't conflict!
    IM_ASSERT(id != 0);                                             // You cannot pass a NULL str_id if the last item has no identifier (e.g. a Text() item)
    int mouse_button = (popup_flags & ImGuiPopupFlags_MouseButtonMask_);
    if (IsMouseReleased(mouse_button) && IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup))
        OpenPopupEx(id, popup_flags);
    return BeginPopupEx(id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings);
}